

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::ZoneVectorBase::_reserve
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sbyte sVar3;
  Error EVar4;
  ZoneAllocator *pZVar5;
  ZoneAllocator *extraout_RAX;
  ZoneAllocator *pZVar6;
  sbyte sVar7;
  ulong uVar8;
  uint sizeOfT_00;
  uint extraout_EDX;
  long *extraout_RDX;
  Slot *pSVar9;
  uint uVar10;
  uint uVar11;
  ZoneVectorBase *unaff_RBX;
  ulong uVar12;
  uint uVar13;
  ZoneAllocator *allocator_00;
  ZoneAllocator *pZVar15;
  uint uVar16;
  ZoneAllocator *pZVar17;
  ZoneAllocator *in_R8;
  long lVar18;
  ulong uVar19;
  ZoneAllocator *pZVar20;
  ZoneAllocator *unaff_R13;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  size_t allocatedBytes;
  uint uStack_11c;
  ulong uStack_118;
  ZoneAllocator *pZStack_110;
  ZoneAllocator *pZStack_108;
  ulong uStack_100;
  long *plStack_f8;
  ZoneAllocator *pZStack_f0;
  ulong uStack_e8;
  ZoneAllocator *pZStack_e0;
  ZoneAllocator *pZStack_d8;
  ulong uStack_d0;
  ZoneAllocator *pZStack_c0;
  ZoneAllocator *pZStack_b8;
  long *plStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  ulong uStack_98;
  ZoneAllocator *pZStack_90;
  ZoneAllocator *pZStack_88;
  ulong uStack_80;
  code *pcStack_78;
  ZoneVectorBase *pZStack_68;
  ZoneAllocator *pZStack_60;
  ZoneAllocator *pZStack_58;
  ulong uStack_50;
  ZoneAllocator *local_40;
  ulong local_38;
  ulong uVar14;
  
  uVar19 = (ulong)this->_capacity;
  uVar16 = 0;
  if (n <= this->_capacity) {
    return 0;
  }
  pZVar17 = (ZoneAllocator *)(ulong)sizeOfT;
  if (n * sizeOfT < n) {
    return 1;
  }
  if (allocator->_zone == (Zone *)0x0) {
    uStack_50 = 0x129f70;
    allocator_00 = allocator;
    _reserve();
    pZVar15 = (ZoneAllocator *)this;
LAB_00129f70:
    uStack_50 = 0x129f75;
    _reserve();
LAB_00129f75:
    uStack_50 = 0x129f7a;
    _reserve();
  }
  else {
    uStack_50 = 0x129e82;
    uVar16 = 0;
    in_R8 = (ZoneAllocator *)ZoneAllocator::_alloc(allocator,(ulong)(n * sizeOfT),&local_38);
    if (in_R8 == (ZoneAllocator *)0x0) {
      return 1;
    }
    allocator_00 = (ZoneAllocator *)this->_data;
    pZVar15 = pZVar17;
    if ((ulong)this->_size != 0) {
      uStack_50 = 0x129eb3;
      local_40 = pZVar17;
      memcpy(in_R8,allocator_00,(ulong)this->_size * (long)pZVar17);
      pZVar15 = local_40;
      unaff_R13 = allocator_00;
      pZVar17 = in_R8;
    }
    unaff_RBX = this;
    if (allocator_00 == (ZoneAllocator *)0x0) {
LAB_00129f3d:
      uVar16 = 0;
      uVar11 = (uint)(local_38 / (ulong)pZVar15);
      this->_capacity = uVar11;
      if (n <= uVar11) {
        this->_data = in_R8;
        return 0;
      }
      goto LAB_00129f70;
    }
    if (allocator->_zone == (Zone *)0x0) goto LAB_00129f75;
    uVar19 = uVar19 * (long)pZVar15;
    if (uVar19 != 0) {
      if (uVar19 < 0x201) {
        if (uVar19 < 0x81) {
          uVar19 = uVar19 + 0x1fffffffff >> 5;
        }
        else {
          uVar19 = (uVar19 + 0x3fffffff7f >> 6) + 4;
        }
        allocator_00->_zone = (Zone *)allocator->_slots[uVar19 & 0xffffffff];
        allocator->_slots[uVar19 & 0xffffffff] = (Slot *)allocator_00;
      }
      else {
        uStack_50 = 0x129f10;
        ZoneAllocator::_releaseDynamic(allocator,allocator_00,uVar19);
        unaff_R13 = pZVar15;
        pZVar17 = in_R8;
      }
      goto LAB_00129f3d;
    }
  }
  uStack_50 = 0x129f7f;
  _reserve();
  uVar12 = (ulong)sizeOfT_00;
  uVar11 = *(uint *)pZVar15->_slots;
  uStack_80 = (ulong)uVar11;
  pZStack_68 = unaff_RBX;
  pZStack_60 = allocator;
  pZStack_58 = pZVar17;
  uStack_50 = (ulong)n;
  if (uVar16 <= *(uint *)((long)pZVar15->_slots + 4)) {
LAB_00129f97:
    if (uVar11 < uVar16) {
      pcStack_78 = (code *)0x129fb8;
      memset((uint8_t **)((long)&pZVar15->_zone->_ptr + uStack_80 * uVar12),0,
             (uVar16 - uVar11) * uVar12);
    }
    *(uint *)pZVar15->_slots = uVar16;
    return 0;
  }
  pcStack_78 = (code *)0x129fd8;
  pZVar17 = pZVar15;
  EVar4 = _grow((ZoneVectorBase *)pZVar15,allocator_00,sizeOfT_00,uVar16 - uVar11);
  uVar8 = (ulong)EVar4;
  if (EVar4 != 0) {
    return 1;
  }
  if (uVar16 <= *(uint *)((long)pZVar15->_slots + 4)) goto LAB_00129f97;
  pcStack_78 = ZoneBitVector::copyFrom;
  _resize();
  uVar11 = *(uint *)(extraout_RDX + 1);
  pZVar20 = (ZoneAllocator *)(ulong)uVar11;
  if (uVar11 == 0) {
    *(undefined4 *)pZVar17->_slots = 0;
    return 0;
  }
  pZVar6 = (ZoneAllocator *)pZVar17->_zone;
  uVar13 = uVar11 + 0x3f;
  uVar14 = (ulong)uVar13;
  plStack_b0 = extraout_RDX;
  pZVar5 = pZVar6;
  if (uVar11 <= *(uint *)((long)pZVar17->_slots + 4)) goto LAB_0012a08e;
  uVar10 = uVar13 & 0xffffffc0;
  if (uVar10 < uVar11) {
    return 1;
  }
  uStack_a0 = (ulong)uVar16;
  uStack_98 = uVar19;
  pZStack_90 = unaff_R13;
  pZStack_88 = pZVar15;
  pcStack_78 = (code *)uVar12;
  if (allocator_00->_zone == (Zone *)0x0) {
    uStack_d0 = 0x12a101;
    allocator_00 = pZVar17;
    ZoneBitVector::copyFrom();
    pZVar5 = extraout_RAX;
LAB_0012a101:
    uVar19 = (ulong)uVar10;
  }
  else {
    uStack_d0 = 0x12a05a;
    pZStack_b8 = allocator_00;
    pZVar5 = (ZoneAllocator *)ZoneAllocator::_alloc(allocator_00,(ulong)(uVar10 >> 3),&uStack_a8);
    if (pZVar5 == (ZoneAllocator *)0x0) {
      return 1;
    }
    uVar19 = uStack_a8 * 8;
    uVar8 = uStack_a8;
    if (uVar19 < uStack_a8) goto LAB_0012a101;
  }
  uVar16 = (uint)uVar8;
  if (pZVar6 == (ZoneAllocator *)0x0) {
LAB_0012a084:
    pZVar17->_zone = (Zone *)pZVar5;
    *(int *)((long)pZVar17->_slots + 4) = (int)uVar19;
LAB_0012a08e:
    *(uint *)pZVar17->_slots = uVar11;
    if (0x3f < uVar13) {
      lVar18 = *plStack_b0;
      uVar19 = 0;
      do {
        pZVar5->_slots[uVar19 - 1] = *(Slot **)(lVar18 + uVar19 * 8);
        uVar19 = uVar19 + 1;
      } while (uVar13 >> 6 != uVar19);
    }
    return 0;
  }
  pZVar15 = pZStack_b8;
  if (pZStack_b8->_zone == (Zone *)0x0) {
    uStack_d0 = 0x12a10e;
    ZoneBitVector::copyFrom();
  }
  else {
    uVar10 = *(uint *)((long)pZVar17->_slots + 4);
    allocator_00 = (ZoneAllocator *)(ulong)uVar10;
    pZStack_c0 = pZVar5;
    if (7 < uVar10) {
      uStack_d0 = 0x12a0f5;
      ZoneBitVector::copyFrom();
      pZVar5 = pZStack_c0;
      goto LAB_0012a084;
    }
  }
  uStack_d0 = 0x12a113;
  ZoneBitVector::copyFrom();
  plStack_f8 = plStack_b0;
  pZStack_f0 = pZVar20;
  uStack_e8 = uVar19;
  pZStack_e0 = pZVar6;
  pZStack_d8 = pZVar17;
  uStack_d0 = uVar14;
  if (uVar16 < extraout_EDX) {
    ZoneBitVector::_resize();
    pZVar5 = pZVar15;
    allocator_00 = pZVar20;
LAB_0012a3b8:
    uVar11 = (uint)plStack_b0;
    ZoneBitVector::_resize();
LAB_0012a3bd:
    uVar12 = (ulong)uVar13;
LAB_0012a1ba:
    if (0x3f < uVar11 + 0x3f) {
      uVar19 = 0;
      do {
        pZVar6->_slots[uVar19 - 1] = pZVar17->_slots[uVar19 - 1];
        uVar19 = uVar19 + 1;
      } while (uVar11 + 0x3f >> 6 != uVar19);
LAB_0012a1f3:
      if (pZStack_110->_zone == (Zone *)0x0) {
        ZoneBitVector::_resize();
      }
      else {
        uVar16 = *(uint *)((long)allocator_00->_slots + 4);
        if (7 < uVar16) {
          uVar19 = (ulong)(uVar16 >> 3);
          if (uVar16 < 0x1008) {
            if (uVar16 < 0x408) {
              uVar19 = uVar19 + 0x1fffffffff >> 5;
            }
            else {
              uVar19 = (uVar19 + 0x3fffffff7f >> 6) + 4;
            }
            pZVar17->_zone = (Zone *)pZStack_110->_slots[uVar19 & 0xffffffff];
            pZStack_110->_slots[uVar19 & 0xffffffff] = (Slot *)pZVar17;
          }
          else {
            ZoneAllocator::_releaseDynamic(pZStack_110,pZVar17,uVar19);
          }
          goto LAB_0012a264;
        }
      }
      ZoneBitVector::_resize();
      goto LAB_0012a3cf;
    }
    if (pZVar17 != (ZoneAllocator *)0x0) goto LAB_0012a1f3;
LAB_0012a264:
    allocator_00->_zone = (Zone *)pZVar6;
    *(int *)((long)allocator_00->_slots + 4) = (int)uVar12;
    in_R8 = (ZoneAllocator *)(ulong)uStack_11c;
    pZVar5 = pZStack_108;
    uVar19 = uStack_118;
    pZVar17 = pZVar6;
  }
  else {
    uVar19 = (ulong)extraout_EDX;
    pZStack_108 = (ZoneAllocator *)allocator_00->_slots;
    uVar11 = *(uint *)allocator_00->_slots;
    plStack_b0 = (long *)(ulong)uVar11;
    if (extraout_EDX <= uVar11) {
      ZoneBitVector::_resize();
      return 0;
    }
    pZVar17 = (ZoneAllocator *)allocator_00->_zone;
    pZVar5 = pZStack_108;
    if (*(uint *)((long)allocator_00->_slots + 4) < extraout_EDX) {
      uStack_11c = (uint)in_R8;
      uVar13 = uVar16 + 0x3f & 0xffffffc0;
      if (uVar13 < extraout_EDX) {
        return 1;
      }
      if (pZVar15->_zone == (Zone *)0x0) goto LAB_0012a3b8;
      pZVar5 = (ZoneAllocator *)(ulong)(uVar13 >> 3);
      pZVar6 = (ZoneAllocator *)ZoneAllocator::_alloc(pZVar15,(size_t)pZVar5,&uStack_100);
      if (pZVar6 == (ZoneAllocator *)0x0) {
        return 1;
      }
      uVar12 = uStack_100 * 8;
      uStack_118 = uVar19;
      pZStack_110 = pZVar15;
      if (uVar12 < uStack_100) goto LAB_0012a3bd;
      goto LAB_0012a1ba;
    }
  }
  uVar16 = uVar11 >> 6;
  pZStack_110 = (ZoneAllocator *)(ulong)uVar16;
  uVar13 = (uint)uVar19;
  sVar3 = (sbyte)(uVar13 & 0x3f);
  pSVar9 = (Slot *)-((ulong)in_R8 & 0xff);
  uVar11 = uVar11 & 0x3f;
  if (uVar11 != 0) {
    sVar7 = 0;
    if ((uVar16 == ((uint)(uVar19 >> 6) & 0x3ffffff)) && (sVar7 = sVar3, (uVar13 & 0x3f) <= uVar11))
    {
LAB_0012a3cf:
      uVar16 = (uint)pZVar5;
      ZoneBitVector::_resize();
      uVar19 = 0x41;
      if (uVar16 < 0x41) {
        uVar19 = (ulong)uVar16;
      }
      EVar4 = String::_opString((String *)pZStack_110,kAppend,
                                "None" + arm::FormatterInternal::formatFeature::sFeatureIndex
                                         [uVar19],0xffffffffffffffff);
      return EVar4;
    }
    pZVar17->_slots[(long)((long)&pZStack_110[-1]._dynamicBlocks + 7)] =
         (Slot *)((ulong)pZVar17->_slots[(long)((long)&pZStack_110[-1]._dynamicBlocks + 7)] |
                 (long)pSVar9 << (sVar7 - (char)uVar11 & 0x3fU));
    uVar16 = uVar16 + 1;
  }
  auVar2 = _DAT_0014bce0;
  auVar1 = _DAT_0014bcd0;
  uVar11 = uVar13 + 0x3f >> 6;
  if (uVar16 < uVar11) {
    uVar8 = (ulong)uVar16;
    lVar18 = (uVar11 - uVar8) + -1;
    auVar21._8_4_ = (int)lVar18;
    auVar21._0_8_ = lVar18;
    auVar21._12_4_ = (int)((ulong)lVar18 >> 0x20);
    uVar12 = 0;
    auVar21 = auVar21 ^ _DAT_0014bce0;
    do {
      auVar22._8_4_ = (int)uVar12;
      auVar22._0_8_ = uVar12;
      auVar22._12_4_ = (int)(uVar12 >> 0x20);
      auVar22 = (auVar22 | auVar1) ^ auVar2;
      if ((bool)(~(auVar22._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar22._0_4_ ||
                  auVar21._4_4_ < auVar22._4_4_) & 1)) {
        pZVar17->_slots[uVar8 + (uVar12 - 1)] = pSVar9;
      }
      if ((auVar22._12_4_ != auVar21._12_4_ || auVar22._8_4_ <= auVar21._8_4_) &&
          auVar22._12_4_ <= auVar21._12_4_) {
        pZVar17->_slots[uVar8 + uVar12] = pSVar9;
      }
      uVar12 = uVar12 + 2;
    } while (((uVar11 - uVar8) + 1 & 0xfffffffffffffffe) != uVar12);
  }
  if ((uVar19 & 0x3f) != 0) {
    pSVar9 = (Slot *)0x0;
    if ((char)in_R8 != '\0') {
      pSVar9 = (Slot *)~(-1L << sVar3);
    }
    pZVar17->_slots[(ulong)(uVar11 - 1) - 1] = pSVar9;
  }
  *(uint *)&pZVar5->_zone = uVar13;
  return 0;
}

Assistant:

Error ZoneVectorBase::_reserve(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t oldCapacity = _capacity;
  if (oldCapacity >= n) return kErrorOk;

  uint32_t nBytes = n * sizeOfT;
  if (ASMJIT_UNLIKELY(nBytes < n))
    return DebugUtils::errored(kErrorOutOfMemory);

  size_t allocatedBytes;
  uint8_t* newData = static_cast<uint8_t*>(allocator->alloc(nBytes, allocatedBytes));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorOutOfMemory);

  void* oldData = _data;
  if (_size)
    memcpy(newData, oldData, size_t(_size) * sizeOfT);

  if (oldData)
    allocator->release(oldData, size_t(oldCapacity) * sizeOfT);

  _capacity = uint32_t(allocatedBytes / sizeOfT);
  ASMJIT_ASSERT(_capacity >= n);

  _data = newData;
  return kErrorOk;
}